

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memtable.cc
# Opt level: O2

Iterator * __thiscall leveldb::MemTable::NewIterator(MemTable *this)

{
  long lVar1;
  MemTableIterator *this_00;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (MemTableIterator *)operator_new(0x58);
  MemTableIterator::MemTableIterator(this_00,&this->table_);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return &this_00->super_Iterator;
  }
  __stack_chk_fail();
}

Assistant:

Iterator* MemTable::NewIterator() { return new MemTableIterator(&table_); }